

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::parse::anon_unknown_0::TestCase89::run(TestCase89 *this)

{
  char **this_00;
  bool bVar1;
  char *begin;
  char *end;
  ParserRef<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_> PVar2;
  bool local_7c;
  bool local_7b;
  undefined1 local_7a [6];
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  ParserRef<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_> wrapped;
  undefined1 local_60;
  Maybe<kj::_::Tuple<>_> local_5f;
  bool local_5d;
  ExactlyConst_<char,__o_> parser;
  bool _kj_shouldLog_5;
  bool _kj_shouldLog_4;
  Maybe<kj::_::Tuple<>_> local_59;
  bool local_57;
  bool local_56;
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  undefined1 local_43;
  Maybe<kj::_::Tuple<>_> local_42;
  undefined1 local_40 [6];
  Maybe<kj::_::Tuple<>_> result;
  Input input;
  StringPtr text;
  TestCase89 *this_local;
  
  this_00 = &input.best;
  StringPtr::StringPtr((StringPtr *)this_00,"foo");
  begin = StringPtr::begin((StringPtr *)this_00);
  end = StringPtr::end((StringPtr *)this_00);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)local_40,begin,end);
  exactlyConst<char,__f_>();
  ExactlyConst_<char,(char)102>::operator()
            ((ExactlyConst_<char,(char)102> *)&local_42,
             (IteratorInput<char,_const_char_*> *)&local_43);
  bVar1 = Maybe<kj::_::Tuple<>_>::operator!=(&local_42,(void *)0x0);
  if (!bVar1) {
    local_56 = kj::_::Debug::shouldLog(ERROR);
    while (local_56 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x5e,ERROR,"\"failed: expected \" \"result != nullptr\"",
                 (char (*) [35])"failed: expected result != nullptr");
      local_56 = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd((IteratorInput<char,_const_char_*> *)local_40);
  if (bVar1) {
    local_57 = kj::_::Debug::shouldLog(ERROR);
    while (local_57 != false) {
      kj::_::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x5f,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
                 (char (*) [34])"failed: expected !(input.atEnd())");
      local_57 = false;
    }
  }
  exactlyConst<char,__o_>();
  ExactlyConst_<char,(char)111>::operator()
            ((ExactlyConst_<char,(char)111> *)&local_59,
             (IteratorInput<char,_const_char_*> *)&_kj_shouldLog_4);
  Maybe<kj::_::Tuple<>_>::operator=(&local_42,&local_59);
  Maybe<kj::_::Tuple<>_>::~Maybe(&local_59);
  bVar1 = Maybe<kj::_::Tuple<>_>::operator!=(&local_42,(void *)0x0);
  if (!bVar1) {
    parser = (ExactlyConst_<char,__o_>)kj::_::Debug::shouldLog(ERROR);
    while (parser != (ExactlyConst_<char,__o_>)0x0) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x62,ERROR,"\"failed: expected \" \"result != nullptr\"",
                 (char (*) [35])"failed: expected result != nullptr");
      parser = (ExactlyConst_<char,__o_>)0x0;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd((IteratorInput<char,_const_char_*> *)local_40);
  if (bVar1) {
    local_5d = kj::_::Debug::shouldLog(ERROR);
    while (local_5d != false) {
      kj::_::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,99,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
                 (char (*) [34])"failed: expected !(input.atEnd())");
      local_5d = false;
    }
  }
  exactlyConst<char,__x_>();
  ExactlyConst_<char,(char)120>::operator()
            ((ExactlyConst_<char,(char)120> *)&local_5f,
             (IteratorInput<char,_const_char_*> *)&local_60);
  Maybe<kj::_::Tuple<>_>::operator=(&local_42,&local_5f);
  Maybe<kj::_::Tuple<>_>::~Maybe(&local_5f);
  bVar1 = Maybe<kj::_::Tuple<>_>::operator==(&local_42,(void *)0x0);
  if (!bVar1) {
    wrapped.wrapper._6_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)wrapped.wrapper._6_1_ != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x66,ERROR,"\"failed: expected \" \"result == nullptr\"",
                 (char (*) [35])"failed: expected result == nullptr");
      wrapped.wrapper._6_1_ = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd((IteratorInput<char,_const_char_*> *)local_40);
  if (bVar1) {
    wrapped.wrapper._5_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)wrapped.wrapper._5_1_ != false) {
      kj::_::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x67,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
                 (char (*) [34])"failed: expected !(input.atEnd())");
      wrapped.wrapper._5_1_ = false;
    }
  }
  exactlyConst<char,__o_>();
  PVar2 = ref<kj::parse::IteratorInput<char,char_const*>,kj::parse::ExactlyConst_<char,(char)111>>
                    ((ExactlyConst_<char,__o_> *)((long)&wrapped.wrapper + 4));
  wrapped.parser = PVar2.wrapper;
  register0x00000000 = PVar2.parser;
  ParserRef<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_>::operator()
            ((ParserRef<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_> *)local_7a,
             (IteratorInput<char,_const_char_*> *)(local_7a + 2));
  Maybe<kj::_::Tuple<>_>::operator=(&local_42,(Maybe<kj::_::Tuple<>_> *)local_7a);
  Maybe<kj::_::Tuple<>_>::~Maybe((Maybe<kj::_::Tuple<>_> *)local_7a);
  bVar1 = Maybe<kj::_::Tuple<>_>::operator!=(&local_42,(void *)0x0);
  if (!bVar1) {
    local_7b = kj::_::Debug::shouldLog(ERROR);
    while (local_7b != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x6c,ERROR,"\"failed: expected \" \"result != nullptr\"",
                 (char (*) [35])"failed: expected result != nullptr");
      local_7b = false;
    }
  }
  bVar1 = IteratorInput<char,_const_char_*>::atEnd((IteratorInput<char,_const_char_*> *)local_40);
  if (!bVar1) {
    local_7c = kj::_::Debug::shouldLog(ERROR);
    while (local_7c != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x6d,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      local_7c = false;
    }
  }
  Maybe<kj::_::Tuple<>_>::~Maybe(&local_42);
  IteratorInput<char,_const_char_*>::~IteratorInput((IteratorInput<char,_const_char_*> *)local_40);
  return;
}

Assistant:

TEST(CommonParsers, ExactlyConstParser) {
  StringPtr text = "foo";
  Input input(text.begin(), text.end());

  Maybe<Tuple<>> result = exactlyConst<char, 'f'>()(input);
  EXPECT_TRUE(result != nullptr);
  EXPECT_FALSE(input.atEnd());

  result = exactlyConst<char, 'o'>()(input);
  EXPECT_TRUE(result != nullptr);
  EXPECT_FALSE(input.atEnd());

  result = exactlyConst<char, 'x'>()(input);
  EXPECT_TRUE(result == nullptr);
  EXPECT_FALSE(input.atEnd());

  auto parser = exactlyConst<char, 'o'>();
  ParserRef<Input, Tuple<>> wrapped = ref<Input>(parser);
  result = wrapped(input);
  EXPECT_TRUE(result != nullptr);
  EXPECT_TRUE(input.atEnd());
}